

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupConeSupp(Gia_Man_t *p,int iLit,Vec_Int_t *vCiIds)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int Entry;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *vObjs;
  Gia_Man_t *pNew;
  char *pcVar4;
  Gia_Obj_t *pObj;
  
  iVar1 = Abc_Lit2Var(iLit);
  pGVar3 = Gia_ManObj(p,iVar1);
  vObjs = Vec_IntAlloc(1000);
  p_00 = &p->vCopies;
  iVar1 = p->nObjs;
  if ((p->vCopies).nSize < iVar1) {
    Vec_IntFillExtra(p_00,iVar1,-1);
    iVar1 = p->nObjs;
  }
  pNew = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar4;
  for (iVar1 = 0; iVar1 < vCiIds->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vCiIds,iVar1);
    pObj = Gia_ManCi(p,iVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pObj);
    Entry = Gia_ManAppendCi(pNew);
    Vec_IntWriteEntry(p_00,iVar2,Entry);
  }
  Gia_ManDupConeSupp_rec(pNew,p,pGVar3,vObjs);
  iVar1 = Abc_Lit2Var(iLit);
  iVar1 = Vec_IntEntry(p_00,iVar1);
  iVar2 = Abc_LitIsCompl(iLit);
  iVar1 = Abc_LitNotCond(iVar1,iVar2);
  Gia_ManAppendCo(pNew,iVar1);
  for (iVar1 = 0; iVar1 < vCiIds->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vCiIds,iVar1);
    pGVar3 = Gia_ManCi(p,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pGVar3);
    Vec_IntWriteEntry(p_00,iVar2,-1);
  }
  for (iVar1 = 0; iVar1 < vObjs->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vObjs,iVar1);
    pGVar3 = Gia_ManObj(p,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pGVar3);
    Vec_IntWriteEntry(p_00,iVar2,-1);
  }
  Vec_IntFree(vObjs);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManDupConeSupp( Gia_Man_t * p, int iLit, Vec_Int_t * vCiIds )
{
    Gia_Man_t * pNew; int i, iLit0;
    Gia_Obj_t * pObj, * pRoot = Gia_ManObj( p, Abc_Lit2Var(iLit) );
    Vec_Int_t * vObjs = Vec_IntAlloc( 1000 );
    //assert( Gia_ObjIsAnd(pRoot) );
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManForEachCiVec( vCiIds, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), Gia_ManAppendCi(pNew) );
    Gia_ManDupConeSupp_rec( pNew, p, pRoot, vObjs );
    iLit0 = Gia_ObjCopyArray( p, Abc_Lit2Var(iLit) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_LitIsCompl(iLit) );
    Gia_ManAppendCo( pNew, iLit0 );
    Gia_ManForEachCiVec( vCiIds, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), -1 );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), -1 );
    Vec_IntFree( vObjs );
    //assert( Vec_IntCountLarger(&p->vCopies, -1) == 0 );
    return pNew;
}